

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result_conflict __thiscall
testing::internal::FunctionMocker<unsigned_int_()>::Invoke(FunctionMocker<unsigned_int_()> *this)

{
  uint uVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<unsigned_int> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<unsigned_int_()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<unsigned_int>_*,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ActionResultHolder<unsigned_int>_*,_false>._M_head_impl.
  _7_1_ = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<unsigned_int>_*,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<unsigned_int>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<unsigned_int>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,std::default_delete<testing::internal::ActionResultHolder<unsigned_int>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<unsigned_int>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,std::default_delete<testing::internal::ActionResultHolder<unsigned_int>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
            ::operator->(&local_20);
  uVar1 = ActionResultHolder<unsigned_int>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<unsigned_int>,_std::default_delete<testing::internal::ActionResultHolder<unsigned_int>_>_>
  ::~unique_ptr(&local_20);
  return uVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }